

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void iqxmlrpc::http::validator::unsigned_number(string *val)

{
  bool bVar1;
  Malformed_packet *this;
  bad_lexical_cast *anon_var_0;
  string local_80;
  locale local_50;
  is_classifiedF local_48;
  char local_38 [8];
  char errmsg [29];
  string *val_local;
  
  builtin_strncpy(errmsg + 8,"meric option",0xd);
  builtin_strncpy(local_38,"bad form",8);
  builtin_strncpy(errmsg,"at of nu",8);
  std::locale::locale(&local_50);
  boost::algorithm::is_digit((algorithm *)&local_48,&local_50);
  bVar1 = boost::algorithm::all<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                    (val,&local_48);
  boost::algorithm::detail::is_classifiedF::~is_classifiedF(&local_48);
  std::locale::~locale(&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    boost::lexical_cast<unsigned_int,std::__cxx11::string>(val);
    return;
  }
  anon_var_0._6_1_ = 1;
  this = (Malformed_packet *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,local_38,(allocator<char> *)((long)&anon_var_0 + 7));
  Malformed_packet::Malformed_packet(this,&local_80);
  anon_var_0._6_1_ = 0;
  __cxa_throw(this,&Malformed_packet::typeinfo,Malformed_packet::~Malformed_packet);
}

Assistant:

void unsigned_number(const std::string& val)
{
  const char errmsg[] = "bad format of numeric option";

  try {
    if (!boost::all(val, boost::is_digit()))
      throw Malformed_packet(errmsg);

    boost::lexical_cast<unsigned>(val);
  } catch (const boost::bad_lexical_cast&) {
    throw Malformed_packet(errmsg);
  }
}